

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

bool tinyusdz::startsWith(string *str,string *t)

{
  ulong uVar1;
  ulong uVar2;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  undefined1 local_31;
  string *t_local;
  string *str_local;
  
  uVar1 = ::std::__cxx11::string::size();
  uVar2 = ::std::__cxx11::string::size();
  local_31 = false;
  if (uVar2 <= uVar1) {
    __first1 = ::std::begin<std::__cxx11::string>(t);
    __last1 = ::std::end<std::__cxx11::string>(t);
    __first2 = ::std::begin<std::__cxx11::string>(str);
    local_31 = ::std::
               equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )__first1._M_current,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )__last1._M_current,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )__first2._M_current);
  }
  return local_31;
}

Assistant:

inline bool startsWith(const std::string &str, const std::string &t) {
  return (str.size() >= t.size()) &&
         std::equal(std::begin(t), std::end(t), std::begin(str));
}